

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall phoenix_evsa_t::evsa_data_t::~evsa_data_t(evsa_data_t *this)

{
  evsa_data_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_data_t_00229200;
  _clean_up(this);
  std::__cxx11::string::~string((string *)&this->m_data_ext);
  std::__cxx11::string::~string((string *)&this->m_data);
  std::
  unique_ptr<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  ::~unique_ptr(&this->m_attributes);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

phoenix_evsa_t::evsa_data_t::~evsa_data_t() {
    _clean_up();
}